

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ArmParser.cpp
# Opt level: O1

int __thiscall ArmParser::decodeCondition(ArmParser *this,string *text,size_t *pos)

{
  byte bVar1;
  byte bVar2;
  size_t sVar3;
  pointer pcVar4;
  bool bVar5;
  char cVar6;
  int iVar7;
  ulong uVar8;
  byte bVar9;
  byte bVar10;
  byte bVar11;
  
  sVar3 = *pos;
  if (text->_M_string_length < sVar3 + 2) {
    return 0xe;
  }
  pcVar4 = (text->_M_dataplus)._M_p;
  bVar1 = pcVar4[sVar3];
  bVar2 = pcVar4[sVar3 + 1];
  *pos = sVar3 + 2;
  iVar7 = 0;
  bVar5 = false;
  if (bVar2 != 0x71 || bVar1 != 0x65) {
    bVar9 = bVar2 ^ 0x65;
    if (bVar1 == 0x6e && bVar9 == 0) {
      iVar7 = 1;
    }
    else {
      bVar10 = bVar2 ^ 0x73;
      iVar7 = 2;
      if (((bVar1 ^ 99) != 0 || bVar10 != 0) && ((bVar1 ^ 0x68) != 0 || bVar10 != 0)) {
        iVar7 = 3;
        if (((bVar1 ^ 99) != 0 || (bVar2 ^ 99) != 0) &&
           (bVar11 = bVar1 ^ 0x6c, bVar2 != 0x6f || bVar11 != 0)) {
          if (bVar1 == 0x6d && (bVar2 ^ 0x69) == 0) {
            iVar7 = 4;
          }
          else {
            uVar8 = CONCAT71((int7)((ulong)pcVar4 >> 8),bVar2) & 0xffffffff ^ 0x6c;
            iVar7 = (int)uVar8;
            cVar6 = (char)uVar8;
            if (bVar1 == 0x70 && cVar6 == '\0') {
              iVar7 = 5;
            }
            else if ((bVar1 ^ 0x76) == 0 && bVar10 == 0) {
              iVar7 = 6;
            }
            else if ((bVar1 ^ 0x76) == 0 && (bVar2 ^ 99) == 0) {
              iVar7 = 7;
            }
            else if ((bVar1 ^ 0x68) == 0 && (bVar2 ^ 0x69) == 0) {
              iVar7 = 8;
            }
            else if (bVar10 == 0 && bVar11 == 0) {
              iVar7 = 9;
            }
            else if ((bVar1 ^ 0x67) == 0 && bVar9 == 0) {
              iVar7 = 10;
            }
            else if (bVar11 == 0 && (bVar2 ^ 0x74) == 0) {
              iVar7 = 0xb;
            }
            else if ((bVar1 ^ 0x67) == 0 && (bVar2 ^ 0x74) == 0) {
              iVar7 = 0xc;
            }
            else if (bVar11 == 0 && bVar9 == 0) {
              iVar7 = 0xd;
            }
            else {
              if (bVar1 != 0x61 || cVar6 != '\0') {
                *pos = sVar3;
                bVar5 = true;
                goto LAB_00161455;
              }
              iVar7 = 0xe;
            }
          }
        }
      }
    }
    bVar5 = false;
  }
LAB_00161455:
  if (bVar5) {
    return 0xe;
  }
  return iVar7;
}

Assistant:

int ArmParser::decodeCondition(const std::string& text, size_t& pos)
{
	if (pos+2 <= text.size())
	{
		char c1 = text[pos+0];
		char c2 = text[pos+1];
		pos += 2;

		if (c1 == 'e' && c2 == 'q') return 0;
		if (c1 == 'n' && c2 == 'e') return 1;
		if (c1 == 'c' && c2 == 's') return 2;
		if (c1 == 'h' && c2 == 's') return 2;
		if (c1 == 'c' && c2 == 'c') return 3;
		if (c1 == 'l' && c2 == 'o') return 3;
		if (c1 == 'm' && c2 == 'i') return 4;
		if (c1 == 'p' && c2 == 'l') return 5;
		if (c1 == 'v' && c2 == 's') return 6;
		if (c1 == 'v' && c2 == 'c') return 7;
		if (c1 == 'h' && c2 == 'i') return 8;
		if (c1 == 'l' && c2 == 's') return 9;
		if (c1 == 'g' && c2 == 'e') return 10;
		if (c1 == 'l' && c2 == 't') return 11;
		if (c1 == 'g' && c2 == 't') return 12;
		if (c1 == 'l' && c2 == 'e') return 13;
		if (c1 == 'a' && c2 == 'l') return 14;

		pos -= 2;
	}

	return 14;
}